

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_0::IndexGroup::init(IndexGroup *this,EVP_PKEY_CTX *ctx)

{
  IndexType type;
  int iVar1;
  int extraout_EAX;
  IndexType type_00;
  IndexType type_01;
  long lVar2;
  allocator<char> local_149;
  DrawTest *local_148;
  int local_13c;
  IndexGroup *local_138;
  long local_130;
  undefined *local_128;
  string desc;
  string iterationDesc;
  string name;
  string local_c0;
  string local_a0;
  DrawTestSpec spec;
  
  deqp::gls::DrawTestSpec::DrawTestSpec(&spec);
  local_138 = this;
  genBasicSpec(&spec,this->m_method);
  spec.indexStorage = STORAGE_BUFFER;
  local_128 = &DAT_018e1010;
  for (local_130 = 0; local_130 != 3; local_130 = local_130 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&desc,"index_",(allocator<char> *)&local_a0);
    type = *(IndexType *)(&DAT_018e1010 + local_130 * 0x10);
    deqp::gls::DrawTestSpec::indexTypeToString_abi_cxx11_
              (&iterationDesc,(DrawTestSpec *)(ulong)type,type_00);
    std::operator+(&name,&desc,&iterationDesc);
    std::__cxx11::string::~string((string *)&iterationDesc);
    std::__cxx11::string::~string((string *)&desc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&iterationDesc,"index ",(allocator<char> *)&local_c0);
    deqp::gls::DrawTestSpec::indexTypeToString_abi_cxx11_
              (&local_a0,(DrawTestSpec *)(ulong)type,type_01);
    std::operator+(&desc,&iterationDesc,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&iterationDesc);
    local_148 = (DrawTest *)operator_new(0x138);
    deqp::gls::DrawTest::DrawTest
              (local_148,
               (local_138->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               ((local_138->super_TestCaseGroup).m_context)->m_renderCtx,name._M_dataplus._M_p,
               desc._M_dataplus._M_p);
    spec.indexType = type;
    for (lVar2 = 1; (lVar2 != 4 && (iVar1 = *(int *)(local_128 + lVar2 * 4), iVar1 != -1));
        lVar2 = lVar2 + 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"first vertex ",&local_149);
      local_13c = deqp::gls::DrawTestSpec::indexTypeSize(type);
      local_13c = iVar1 / local_13c;
      de::toString<int>(&local_c0,&local_13c);
      std::operator+(&iterationDesc,&local_a0,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_a0);
      spec.indexPointerOffset = iVar1;
      deqp::gls::DrawTest::addIteration(local_148,&spec,iterationDesc._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&iterationDesc);
    }
    tcu::TestNode::addChild((TestNode *)local_138,(TestNode *)local_148);
    std::__cxx11::string::~string((string *)&desc);
    std::__cxx11::string::~string((string *)&name);
    local_128 = local_128 + 0x10;
  }
  std::
  _Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ::~_Vector_base(&spec.attribs.
                   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                 );
  return extraout_EAX;
}

Assistant:

void IndexGroup::init (void)
{
	struct IndexTest
	{
		gls::DrawTestSpec::IndexType	type;
		int								offsets[3];
	};

	const IndexTest tests[] =
	{
		{ gls::DrawTestSpec::INDEXTYPE_BYTE,	{ 0, 1, -1 } },
		{ gls::DrawTestSpec::INDEXTYPE_SHORT,	{ 0, 2, -1 } },
		{ gls::DrawTestSpec::INDEXTYPE_INT,		{ 0, 4, -1 } },
	};

	gls::DrawTestSpec spec;
	genBasicSpec(spec, m_method);

	spec.indexStorage = gls::DrawTestSpec::STORAGE_BUFFER;

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(tests); ++testNdx)
	{
		const IndexTest&	indexTest	= tests[testNdx];

		const std::string	name		= std::string("index_") + gls::DrawTestSpec::indexTypeToString(indexTest.type);
		const std::string	desc		= std::string("index ") + gls::DrawTestSpec::indexTypeToString(indexTest.type);
		gls::DrawTest*		test		= new gls::DrawTest(m_testCtx, m_context.getRenderContext(), name.c_str(), desc.c_str());

		spec.indexType			= indexTest.type;

		for (int iterationNdx = 0; iterationNdx < DE_LENGTH_OF_ARRAY(indexTest.offsets) && indexTest.offsets[iterationNdx] != -1; ++iterationNdx)
		{
			const std::string iterationDesc = std::string("first vertex ") + de::toString(indexTest.offsets[iterationNdx] / gls::DrawTestSpec::indexTypeSize(indexTest.type));
			spec.indexPointerOffset	= indexTest.offsets[iterationNdx];
			test->addIteration(spec, iterationDesc.c_str());
		}

		addChild(test);
	}
}